

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O2

bool VulkanUtilities::SetupDebugUtils
               (VkInstance instance,VkDebugUtilsMessageSeverityFlagsEXT messageSeverity,
               VkDebugUtilsMessageTypeFlagsEXT messageType,uint32_t IgnoreMessageCount,
               char **ppIgnoreMessageNames,void *pUserData)

{
  int iVar1;
  char (*Args_1) [41];
  ulong uVar2;
  bool bVar3;
  string msg;
  undefined4 local_74;
  char **local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  long local_58;
  ulong uStack_50;
  code *local_48;
  void *local_40;
  
  local_70 = ppIgnoreMessageNames;
  (anonymous_namespace)::CreateDebugUtilsMessengerEXT =
       (*vkGetInstanceProcAddr)(instance,"vkCreateDebugUtilsMessengerEXT");
  (anonymous_namespace)::DestroyDebugUtilsMessengerEXT =
       (*vkGetInstanceProcAddr)(instance,"vkDestroyDebugUtilsMessengerEXT");
  if ((anonymous_namespace)::DestroyDebugUtilsMessengerEXT == (PFN_vkVoidFunction)0x0 ||
      (anonymous_namespace)::CreateDebugUtilsMessengerEXT == (PFN_vkVoidFunction)0x0) {
    bVar3 = false;
  }
  else {
    uStack_60 = 0;
    local_68 = 0x3b9cbe04;
    local_58 = (ulong)messageSeverity << 0x20;
    uStack_50 = (ulong)messageType;
    local_48 = anon_unknown_0::DebugMessengerCallback;
    Args_1 = (char (*) [41])&(anonymous_namespace)::DbgMessenger;
    local_40 = pUserData;
    iVar1 = (*(anonymous_namespace)::CreateDebugUtilsMessengerEXT)(instance,&local_68,0);
    bVar3 = iVar1 == 0;
    if (!bVar3) {
      Diligent::FormatString<char[39]>(&msg,(char (*) [39])"Failed to create debug utils messenger")
      ;
      Args_1 = (char (*) [41])0xdc;
      Diligent::DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                 "SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xdc);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::
    _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(anonymous_namespace)::g_IgnoreMessages);
    msg._M_dataplus._M_p._0_4_ = 0;
    std::
    _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<char_const(&)[55],int>
              ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(anonymous_namespace)::g_IgnoreMessages,
               "UNASSIGNED-CoreValidation-DrawState-ClearCmdBeforeDraw",&msg);
    for (uVar2 = 0; IgnoreMessageCount != uVar2; uVar2 = uVar2 + 1) {
      Diligent::HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,local_70[uVar2],true);
      local_74 = 0;
      std::
      _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<Diligent::HashMapStringKey,int>
                ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)(anonymous_namespace)::g_IgnoreMessages,&msg,&local_74);
      Diligent::HashMapStringKey::Clear((HashMapStringKey *)&msg);
    }
    (anonymous_namespace)::SetDebugUtilsObjectNameEXT =
         (*vkGetInstanceProcAddr)(instance,"vkSetDebugUtilsObjectNameEXT");
    if ((anonymous_namespace)::SetDebugUtilsObjectNameEXT == (PFN_vkVoidFunction)0x0) {
      Diligent::FormatString<char[26],char[38]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SetDebugUtilsObjectNameEXT != nullptr",(char (*) [38])Args_1);
      Args_1 = (char (*) [41])0xe9;
      Diligent::DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                 "SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xe9);
      std::__cxx11::string::~string((string *)&msg);
    }
    (anonymous_namespace)::SetDebugUtilsObjectTagEXT =
         (*vkGetInstanceProcAddr)(instance,"vkSetDebugUtilsObjectTagEXT");
    if ((anonymous_namespace)::SetDebugUtilsObjectTagEXT == (PFN_vkVoidFunction)0x0) {
      Diligent::FormatString<char[26],char[37]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SetDebugUtilsObjectTagEXT != nullptr",(char (*) [37])Args_1);
      Args_1 = (char (*) [41])0xeb;
      Diligent::DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                 "SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xeb);
      std::__cxx11::string::~string((string *)&msg);
    }
    (anonymous_namespace)::QueueBeginDebugUtilsLabelEXT =
         (*vkGetInstanceProcAddr)(instance,"vkQueueBeginDebugUtilsLabelEXT");
    if ((anonymous_namespace)::QueueBeginDebugUtilsLabelEXT == (PFN_vkVoidFunction)0x0) {
      Diligent::FormatString<char[26],char[40]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"QueueBeginDebugUtilsLabelEXT != nullptr",(char (*) [40])Args_1);
      Args_1 = (char (*) [41])0xee;
      Diligent::DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                 "SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xee);
      std::__cxx11::string::~string((string *)&msg);
    }
    (anonymous_namespace)::QueueEndDebugUtilsLabelEXT =
         (*vkGetInstanceProcAddr)(instance,"vkQueueEndDebugUtilsLabelEXT");
    if ((anonymous_namespace)::QueueEndDebugUtilsLabelEXT == (PFN_vkVoidFunction)0x0) {
      Diligent::FormatString<char[26],char[38]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"QueueEndDebugUtilsLabelEXT != nullptr",(char (*) [38])Args_1);
      Args_1 = (char (*) [41])0xf0;
      Diligent::DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                 "SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xf0);
      std::__cxx11::string::~string((string *)&msg);
    }
    (anonymous_namespace)::QueueInsertDebugUtilsLabelEXT =
         (*vkGetInstanceProcAddr)(instance,"vkQueueInsertDebugUtilsLabelEXT");
    if ((anonymous_namespace)::QueueInsertDebugUtilsLabelEXT == (PFN_vkVoidFunction)0x0) {
      Diligent::FormatString<char[26],char[41]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"QueueInsertDebugUtilsLabelEXT != nullptr",Args_1);
      Diligent::DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                 "SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xf2);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return bVar3;
}

Assistant:

bool SetupDebugUtils(VkInstance                          instance,
                     VkDebugUtilsMessageSeverityFlagsEXT messageSeverity,
                     VkDebugUtilsMessageTypeFlagsEXT     messageType,
                     uint32_t                            IgnoreMessageCount,
                     const char* const*                  ppIgnoreMessageNames,
                     void*                               pUserData)
{
    CreateDebugUtilsMessengerEXT  = reinterpret_cast<PFN_vkCreateDebugUtilsMessengerEXT>(vkGetInstanceProcAddr(instance, "vkCreateDebugUtilsMessengerEXT"));
    DestroyDebugUtilsMessengerEXT = reinterpret_cast<PFN_vkDestroyDebugUtilsMessengerEXT>(vkGetInstanceProcAddr(instance, "vkDestroyDebugUtilsMessengerEXT"));
    if (CreateDebugUtilsMessengerEXT == nullptr || DestroyDebugUtilsMessengerEXT == nullptr)
        return false;

    VkDebugUtilsMessengerCreateInfoEXT DbgMessenger_CI{};
    DbgMessenger_CI.sType           = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
    DbgMessenger_CI.pNext           = NULL;
    DbgMessenger_CI.flags           = 0;
    DbgMessenger_CI.messageSeverity = messageSeverity;
    DbgMessenger_CI.messageType     = messageType;
    DbgMessenger_CI.pfnUserCallback = DebugMessengerCallback;
    DbgMessenger_CI.pUserData       = pUserData;

    auto err = CreateDebugUtilsMessengerEXT(instance, &DbgMessenger_CI, nullptr, &DbgMessenger);
    VERIFY(err == VK_SUCCESS, "Failed to create debug utils messenger");

    g_IgnoreMessages.clear();
    // UNASSIGNED-CoreValidation-DrawState-ClearCmdBeforeDraw:
    // vkCmdClearAttachments() issued on command buffer object 0x... prior to any Draw Cmds. It is recommended you use RenderPass LOAD_OP_CLEAR on Attachments prior to any Draw.
    g_IgnoreMessages.emplace("UNASSIGNED-CoreValidation-DrawState-ClearCmdBeforeDraw", 0);
    for (uint32_t i = 0; i < IgnoreMessageCount; ++i)
    {
        g_IgnoreMessages.emplace(HashMapStringKey{ppIgnoreMessageNames[i], true}, 0);
    }

    // Load function pointers
    SetDebugUtilsObjectNameEXT = reinterpret_cast<PFN_vkSetDebugUtilsObjectNameEXT>(vkGetInstanceProcAddr(instance, "vkSetDebugUtilsObjectNameEXT"));
    VERIFY_EXPR(SetDebugUtilsObjectNameEXT != nullptr);
    SetDebugUtilsObjectTagEXT = reinterpret_cast<PFN_vkSetDebugUtilsObjectTagEXT>(vkGetInstanceProcAddr(instance, "vkSetDebugUtilsObjectTagEXT"));
    VERIFY_EXPR(SetDebugUtilsObjectTagEXT != nullptr);

    QueueBeginDebugUtilsLabelEXT = reinterpret_cast<PFN_vkQueueBeginDebugUtilsLabelEXT>(vkGetInstanceProcAddr(instance, "vkQueueBeginDebugUtilsLabelEXT"));
    VERIFY_EXPR(QueueBeginDebugUtilsLabelEXT != nullptr);
    QueueEndDebugUtilsLabelEXT = reinterpret_cast<PFN_vkQueueEndDebugUtilsLabelEXT>(vkGetInstanceProcAddr(instance, "vkQueueEndDebugUtilsLabelEXT"));
    VERIFY_EXPR(QueueEndDebugUtilsLabelEXT != nullptr);
    QueueInsertDebugUtilsLabelEXT = reinterpret_cast<PFN_vkQueueInsertDebugUtilsLabelEXT>(vkGetInstanceProcAddr(instance, "vkQueueInsertDebugUtilsLabelEXT"));
    VERIFY_EXPR(QueueInsertDebugUtilsLabelEXT != nullptr);

    return err == VK_SUCCESS;
}